

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanomsg_reader.cc
# Opt level: O1

bool __thiscall NanomsgReader::nextPacket(NanomsgReader *this,array<unsigned_char,_892UL> *out)

{
  void *msg;
  int iVar1;
  char *pcVar2;
  runtime_error *this_00;
  void *buf;
  stringstream ss;
  void *local_1d0;
  string local_1c8 [32];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  local_1d0 = (void *)0x0;
  do {
    iVar1 = nn_recv(this->fd_,&local_1d0,0xffffffffffffffff,0);
    msg = local_1d0;
    if (iVar1 < 0) {
      std::__cxx11::stringstream::stringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(local_198,"nn_recv: ",9);
      iVar1 = nn_errno();
      pcVar2 = nn_strerror(iVar1);
      std::operator<<(local_198,pcVar2);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_00,local_1c8);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  } while (iVar1 != 0x37c);
  memcpy(out,local_1d0,0x37c);
  nn_freemsg(msg);
  return true;
}

Assistant:

bool NanomsgReader::nextPacket(std::array<uint8_t, 892>& out) {
  void* buf = nullptr;
  int nbytes;
  for (;;) {
    nbytes = nn_recv(fd_, &buf, NN_MSG, 0);
    if (nbytes < 0) {
      std::stringstream ss;
      ss << "nn_recv: " << nn_strerror(nn_errno());
      throw std::runtime_error(ss.str());
    }
    if (nbytes != (int) out.size()) {
      continue;
    }

    memcpy(out.data(), buf, nbytes);
    nn_freemsg(buf);
    return true;
  }
}